

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void liblogger::LogManager::FilterRemove(shared_ptr<liblogger::ILogFilter> *filter)

{
  LogException *this;
  long lVar1;
  LogManagerScopedLock lock;
  allocator<char> local_41;
  string local_40;
  
  Lock();
  lVar1 = DAT_00154d38;
  lock.m_locked = true;
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
  ::remove((list<std::shared_ptr<liblogger::ILogFilter>,_std::allocator<std::shared_ptr<liblogger::ILogFilter>_>_>
            *)&m_filters_abi_cxx11_,(char *)filter);
  if (lVar1 != DAT_00154d38) {
    LogManagerScopedLock::~LogManagerScopedLock(&lock);
    return;
  }
  this = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"LogManager::FilterRemove cannot find filter module",&local_41);
  LogException::LogException(this,&local_40);
  __cxa_throw(this,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogManager::FilterRemove(std::shared_ptr<ILogFilter> filter)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	size_t size = m_filters.size();
	m_filters.remove(filter);
	if (size == m_filters.size())
		throw(LogException("LogManager::FilterRemove cannot find filter module"));
}